

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O0

newtRef NewtMakeSlotsObj(newtRefArg r,uint32_t n,uint16_t type)

{
  newtObjRef v;
  newtRef *pnVar1;
  uint local_3c;
  uint32_t i;
  newtRef *slots;
  uint32_t size;
  newtObjRef obj;
  uint16_t type_local;
  uint32_t n_local;
  newtRefArg r_local;
  
  v = NewtObjAlloc(r,n << 3,type | 1,false);
  if (v == (newtObjRef)0x0) {
    r_local = 2;
  }
  else {
    pnVar1 = NewtObjToSlots(v);
    for (local_3c = 0; local_3c < n; local_3c = local_3c + 1) {
      pnVar1[local_3c] = 0xfff2;
    }
    r_local = NewtMakePointer(v);
  }
  return r_local;
}

Assistant:

newtRef NewtMakeSlotsObj(newtRefArg r, uint32_t n, uint16_t type)
{
    newtObjRef	obj;
    uint32_t	size;
    
    size = sizeof(newtRef) * n;
    obj = NewtObjAlloc(r, size, kNewtObjSlotted | type, false);
    
    if (obj != NULL)
    {
        newtRef *	slots;
        uint32_t	i;
        
        slots = NewtObjToSlots(obj);
        
        for (i = 0; i < n; i++)
        {
            slots[i] = kNewtRefUnbind;
        }
        
        return NewtMakePointer(obj);
    }
    
    return kNewtRefNIL;
}